

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall
ON_Viewport::GetBoundingBoxProjectionExtents
          (ON_Viewport *this,ON_BoundingBox bbox,ON_Interval *x_extents,ON_Interval *y_extents)

{
  undefined1 auVar1 [16];
  ON_3dPoint from_pt;
  ON_PlaneEquation e_00;
  ON_PlaneEquation e_01;
  ON_PlaneEquation e_02;
  ON_3dPoint to_pt;
  ON_Viewport *this_00;
  bool bVar2;
  undefined4 uVar3;
  ON_BoundingBox *pOVar4;
  double *pdVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  ulong uVar6;
  long lVar7;
  int j;
  int iVar8;
  long lVar9;
  bool bVar10;
  ON_Interval *this_01;
  uint uVar11;
  uint uVar12;
  double dVar13;
  ON_3dPoint clipping_point;
  double t;
  ON_BoundingBox clipping_bbox;
  ON_3dPoint cam_loc;
  ON_PlaneEquation vp_far_plane;
  ON_PlaneEquation vp_near_plane;
  ON_Interval unit_interval;
  ON_3dPoint P;
  ON_3dPoint far_rect [4];
  ON_Line camera_ray;
  ON_3dPoint bbox_point;
  ON_PlaneEquation e;
  ON_3dPoint local_538;
  double local_520;
  double local_518;
  ON_Viewport *local_510;
  ON_Interval *local_508;
  ON_Interval *local_500;
  ulong local_4f8;
  ON_3dPoint local_4f0;
  ON_Line local_4d8;
  ON_BoundingBox local_4a8;
  ON_3dPoint local_478;
  ON_PlaneEquation local_458;
  ON_PlaneEquation local_438;
  ON_Interval local_418;
  ON_PlaneEquation local_408 [4];
  ON_3dPoint local_388;
  ON_3dPoint local_370;
  ON_3dPoint local_358;
  ON_3dPoint local_340;
  ON_Line local_328;
  ON_Xform local_2f8;
  undefined1 local_278 [24];
  double adStack_260 [70];
  
  ON_Interval::ON_Interval(&local_418,0.0,1.0);
  x_extents->m_t[0] = local_418.m_t[0];
  x_extents->m_t[1] = local_418.m_t[1];
  y_extents->m_t[0] = local_418.m_t[0];
  y_extents->m_t[1] = local_418.m_t[1];
  local_508 = x_extents;
  local_500 = y_extents;
  bVar2 = ON_BoundingBox::IsValid(&bbox);
  if ((!bVar2) || ((this->m_bValidCamera == false && (this->m_bValidFrustum != true)))) {
    return false;
  }
  local_478.z = (this->m_CamLoc).z;
  local_478.x = (this->m_CamLoc).x;
  local_478.y = (this->m_CamLoc).y;
  bVar2 = ON_3dPoint::IsValid(&local_478);
  if (!bVar2) {
    return false;
  }
  bVar2 = GetFarRect(this,&local_388,&local_370,&local_340,&local_358);
  if (!bVar2) {
    return false;
  }
  local_510 = this;
  ON_3dPoint::ON_3dPoint(&local_538,-1.23432101234321e+308,-1.23432101234321e+308,0.0);
  ON_BoundingBox::ON_BoundingBox(&local_4a8);
  local_4a8.m_min.z = local_538.z;
  local_4a8.m_max.z = local_538.z;
  from_pt.y = local_478.y;
  from_pt.x = local_478.x;
  from_pt.z = local_478.z;
  to_pt.y = ON_3dPoint::UnsetPoint.y;
  to_pt.x = ON_3dPoint::UnsetPoint.x;
  to_pt.z = ON_3dPoint::UnsetPoint.z;
  ON_Line::ON_Line(&local_328,from_pt,to_pt);
  uVar6 = 0;
  do {
    local_328.to.z = (&local_388)[uVar6].z;
    local_328.to.x = (&local_388)[uVar6].x;
    local_328.to.y = (&local_388)[uVar6].y;
    local_518 = 1.0;
    if (1 < (int)uVar6 - 1U) {
      local_518 = -1.0;
    }
    local_520 = 1.0;
    if (uVar6 < 2) {
      local_520 = -1.0;
    }
    iVar8 = 0;
    local_4f8 = uVar6;
    do {
      uVar11 = 0x3ff00000;
      if (iVar8 != 0) {
        uVar11 = 0;
      }
      uVar12 = 0x3ff00000;
      if (iVar8 != 1) {
        uVar12 = 0;
      }
      dVar13 = 1.0;
      if (iVar8 != 2) {
        dVar13 = 0.0;
      }
      ON_PlaneEquation::ON_PlaneEquation
                ((ON_PlaneEquation *)local_278,(double)((ulong)uVar11 << 0x20),
                 (double)((ulong)uVar12 << 0x20),dVar13,0.0);
      bVar2 = true;
      do {
        bVar10 = bVar2;
        pOVar4 = (ON_BoundingBox *)&bbox.m_max;
        if (bVar10) {
          pOVar4 = &bbox;
        }
        local_2f8.m_xform[0][2] = (pOVar4->m_min).z;
        local_2f8.m_xform[0][0] = (pOVar4->m_min).x;
        local_2f8.m_xform[0][1] = (pOVar4->m_min).y;
        adStack_260[0] = 0.0;
        pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)&local_2f8,iVar8);
        adStack_260[0] = -*pdVar5;
        local_4d8.from.x = -1.23432101234321e+308;
        bVar2 = ON_Intersect(&local_328,(ON_PlaneEquation *)local_278,(double *)&local_4d8);
        uVar3 = (undefined4)CONCAT71(extraout_var,bVar2 && 0.0 < local_4d8.from.x);
        if (bVar2 && 0.0 < local_4d8.from.x) {
          ON_Line::PointAt((ON_3dPoint *)local_408,&local_328,local_4d8.from.x);
          pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)&local_2f8,iVar8);
          dVar13 = *pdVar5;
          pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)local_408,iVar8);
          *pdVar5 = dVar13;
          bVar2 = ON_BoundingBox::IsPointIn(&bbox,(ON_3dPoint *)local_408,0);
          uVar3 = (undefined4)CONCAT71(extraout_var_00,bVar2);
          if (bVar2) {
            local_538.x = local_518;
            local_538.y = local_520;
            bVar2 = ON_BoundingBox::Set(&local_4a8,&local_538,1);
            uVar3 = (undefined4)CONCAT71(extraout_var_01,bVar2);
          }
        }
        bVar2 = false;
      } while (bVar10);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 3);
    uVar6 = local_4f8 + 1;
  } while (uVar6 != 4);
  auVar1._4_4_ = -(uint)(local_4a8.m_min.y != -1.0);
  auVar1._0_4_ = -(uint)(local_4a8.m_min.x != -1.0);
  auVar1._8_4_ = -(uint)(local_4a8.m_max.x != 1.0);
  auVar1._12_4_ = -(uint)(local_4a8.m_max.y != 1.0);
  iVar8 = movmskps(uVar3,auVar1);
  if (iVar8 == 0) {
LAB_0066dd2d:
    bVar2 = ON_BoundingBox::IsValid(&local_4a8);
    if (bVar2) {
      this_01 = (ON_Interval *)local_278;
      ON_Interval::ON_Interval(this_01);
      ON_Interval::ON_Interval((ON_Interval *)(local_278 + 0x10));
      iVar8 = 0;
      bVar2 = true;
      do {
        bVar10 = bVar2;
        pdVar5 = ON_3dPoint::operator[](&local_4a8.m_min,iVar8);
        dVar13 = *pdVar5;
        pdVar5 = ON_3dPoint::operator[](&local_4a8.m_max,iVar8);
        ON_Interval::Set(this_01,(dVar13 + 1.0) * 0.5,(*pdVar5 + 1.0) * 0.5);
        bVar2 = ON_Interval::IsIncreasing(this_01);
        if ((((!bVar2) && (bVar2 = ON_Interval::IsSingleton(this_01), !bVar2)) ||
            ((bVar2 = ON_Interval::Intersection(this_01,&local_418), !bVar2 ||
             (bVar2 = ON_Interval::IsValid(this_01), !bVar2)))) ||
           ((bVar2 = ON_Interval::IsIncreasing(this_01), !bVar2 &&
            (bVar2 = ON_Interval::IsSingleton(this_01), !bVar2)))) goto LAB_0066de6d;
        iVar8 = 1;
        this_01 = (ON_Interval *)(local_278 + 0x10);
        bVar2 = false;
      } while (bVar10);
      local_508->m_t[0] = (double)local_278._0_8_;
      local_508->m_t[1] = (double)local_278._8_8_;
      local_500->m_t[0] = (double)local_278._16_8_;
      local_500->m_t[1] = adStack_260[0];
      bVar2 = true;
      goto LAB_0066de6f;
    }
  }
  else {
    ON_Xform::ON_Xform(&local_2f8);
    this_00 = local_510;
    bVar2 = GetXform(local_510,world_cs,clip_cs,&local_2f8);
    if (bVar2) {
      ON_PlaneEquation::ON_PlaneEquation(&local_438);
      bVar2 = GetNearPlaneEquation(this_00,&local_438);
      if (bVar2) {
        ON_PlaneEquation::ON_PlaneEquation(&local_458);
        bVar2 = GetFarPlaneEquation(this_00,&local_458);
        if (bVar2) {
          lVar7 = 0;
          do {
            ON_PlaneEquation::ON_PlaneEquation((ON_PlaneEquation *)((long)&local_408[0].x + lVar7));
            lVar7 = lVar7 + 0x20;
          } while (lVar7 != 0x80);
          bVar2 = GetFrustumLeftPlaneEquation(this_00,local_408);
          if ((((bVar2) && (bVar2 = GetFrustumBottomPlaneEquation(this_00,local_408 + 1), bVar2)) &&
              (bVar2 = GetFrustumRightPlaneEquation(this_00,local_408 + 2), bVar2)) &&
             (bVar2 = GetFrustumTopPlaneEquation(this_00,local_408 + 3), bVar2)) {
            lVar7 = 0;
            do {
              ON_Line::ON_Line((ON_Line *)(local_278 + lVar7));
              lVar7 = lVar7 + 0x30;
            } while (lVar7 != 0x240);
            ON_BoundingBox::GetEdges(&bbox,(ON_Line *)local_278);
            lVar7 = 0;
            do {
              local_4d8.from.x = *(double *)(local_278 + lVar7 * 0x30);
              local_4d8.from.y = *(double *)(local_278 + lVar7 * 0x30 + 8);
              local_4d8.from.z = adStack_260[lVar7 * 6 + -1];
              local_4d8.to.x = adStack_260[lVar7 * 6];
              local_4d8.to.y = adStack_260[lVar7 * 6 + 1];
              local_4d8.to.z = adStack_260[lVar7 * 6 + 2];
              e_00.y = local_438.y;
              e_00.x = local_438.x;
              e_00.z = local_438.z;
              e_00.d = local_438.d;
              bVar2 = TrimLineHelper(e_00,true,&local_4d8);
              if ((bVar2) &&
                 (e_01.y = local_458.y, e_01.x = local_458.x, e_01.z = local_458.z,
                 e_01.d = local_458.d, bVar2 = TrimLineHelper(e_01,false,&local_4d8), bVar2)) {
                lVar9 = 0;
                do {
                  e_02.y = (double)*(undefined8 *)((long)&local_408[0].y + lVar9);
                  e_02.x = (double)*(undefined8 *)((long)&local_408[0].x + lVar9);
                  e_02.z = (double)*(undefined8 *)((long)&local_408[0].z + lVar9);
                  e_02.d = *(double *)((long)&local_408[0].d + lVar9);
                  bVar2 = TrimLineHelper(e_02,false,&local_4d8);
                  if (!bVar2) {
                    local_4d8.from.z = ON_3dPoint::UnsetPoint.z;
                    local_4d8.from.x = ON_3dPoint::UnsetPoint.x;
                    local_4d8.from.y = ON_3dPoint::UnsetPoint.y;
                    local_4d8.to.z = ON_3dPoint::UnsetPoint.z;
                    local_4d8.to.x = ON_3dPoint::UnsetPoint.x;
                    local_4d8.to.y = ON_3dPoint::UnsetPoint.y;
                    break;
                  }
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0x80);
                bVar2 = ON_Line::IsValid(&local_4d8);
                if (bVar2) {
                  ON_Xform::operator*(&local_4f0,&local_2f8,&local_4d8.from);
                  local_538.z = local_4f0.z;
                  local_538.x = local_4f0.x;
                  local_538.y = local_4f0.y;
                  ON_BoundingBox::Set(&local_4a8,&local_538,1);
                  ON_Xform::operator*(&local_4f0,&local_2f8,&local_4d8.to);
                  local_538.z = local_4f0.z;
                  local_538.x = local_4f0.x;
                  local_538.y = local_4f0.y;
                  ON_BoundingBox::Set(&local_4a8,&local_538,1);
                }
              }
              ON_Line::~ON_Line(&local_4d8);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 0xc);
            lVar7 = 0x210;
            do {
              ON_Line::~ON_Line((ON_Line *)(local_278 + lVar7));
              lVar7 = lVar7 + -0x30;
            } while (lVar7 != -0x30);
            goto LAB_0066dd2d;
          }
        }
      }
    }
  }
LAB_0066de6d:
  bVar2 = false;
LAB_0066de6f:
  ON_Line::~ON_Line(&local_328);
  return bVar2;
}

Assistant:

bool ON_Viewport::GetBoundingBoxProjectionExtents(
    ON_BoundingBox bbox,
    ON_Interval& x_extents,
    ON_Interval& y_extents
    ) const
{
  const ON_Interval unit_interval(0.0,1.0);
  x_extents = unit_interval;
  y_extents = unit_interval;

  if ( !bbox.IsValid() )
    return false;

  if ( !IsValidCamera() && !IsValidFrustum() )
    return false;

  const ON_3dPoint cam_loc = CameraLocation();
  if ( !cam_loc.IsValid() )
    return false;

  // far_rect[] points run image ccw 
  // (image lower left, lower right, upper right, upper left)
  ON_3dPoint far_rect[4];
  if ( !GetFarRect(far_rect[0],far_rect[1],far_rect[3],far_rect[2]) )
    return false;

  ON_3dPoint clipping_point(ON_UNSET_VALUE,ON_UNSET_VALUE,0.0);
  ON_BoundingBox clipping_bbox;
  clipping_bbox.m_min.z = clipping_point.z;
  clipping_bbox.m_max.z = clipping_point.z;

  ON_Line camera_ray(cam_loc,ON_3dPoint::UnsetPoint);
  for ( int i = 0; i < 4; i++ )
  {
    camera_ray.to = far_rect[i];
    for ( int j = 0; j < 3; j++ )
    {
      ON_PlaneEquation e(0==j ? 1.0 : 0.0, 1 == j ? 1.0 : 0.0, 2==j?1.0:0.0, 0.0);
      for ( int k = 0; k < 2; k++ )
      {
        ON_3dPoint bbox_point = k ? bbox.m_max : bbox.m_min;
        e.d = 0.0;
        e.d = -bbox_point[j];
        double t = ON_UNSET_VALUE;
        if ( ON_Intersect(camera_ray,e,&t) )
        {
          if ( t > 0.0 )
          {
            ON_3dPoint P = camera_ray.PointAt(t);
            P[j] = bbox_point[j];
            if ( bbox.IsPointIn(P) )
            {
              clipping_point.x = (1 == i || 2 == i) ? 1.0 : -1.0;
              clipping_point.y = (i >= 2) ? 1.0 : -1.0;
              clipping_bbox.Set(clipping_point,true);
            }
          }
        }
      }
    }
  }

  if (    clipping_bbox.m_min.x != -1.0 || clipping_bbox.m_min.y != -1.0
       || clipping_bbox.m_max.x !=  1.0 || clipping_bbox.m_max.y !=  1.0
     )
  {
    ON_Xform w2c;
    if ( !GetXform(ON::world_cs,ON::clip_cs,w2c) )
      return false;

    ON_PlaneEquation vp_near_plane;
    if ( !GetNearPlaneEquation(vp_near_plane) )
      return false;

    ON_PlaneEquation vp_far_plane;
    if ( !GetFarPlaneEquation(vp_far_plane) )
      return false;

    ON_PlaneEquation frustum_sides[4];
    if ( !GetFrustumLeftPlaneEquation(frustum_sides[0]) )
      return false;
    if ( !GetFrustumBottomPlaneEquation(frustum_sides[1]) )
      return false;
    if ( !GetFrustumRightPlaneEquation(frustum_sides[2]) )
      return false;
    if ( !GetFrustumTopPlaneEquation(frustum_sides[3]) )
      return false;

    ON_Line bbox_lines[12];
    bbox.GetEdges(bbox_lines);

    for ( int i = 0; i < 12; i++ )
    {
      ON_Line line = bbox_lines[i];

      if ( !TrimLineHelper( vp_near_plane, true, line ) )
        continue;

      if ( !TrimLineHelper( vp_far_plane, false, line ) )
        continue;

      for ( int j = 0; j < 4; j++ )
      {
        if ( !TrimLineHelper(frustum_sides[j],false,line) )
        {
          line.from = ON_3dPoint::UnsetPoint;
          line.to = ON_3dPoint::UnsetPoint;
          break;
        }
      }

      if ( !line.IsValid() )
        continue;      

      clipping_point = w2c*line.from;
      clipping_bbox.Set(clipping_point,true);

      clipping_point = w2c*line.to;
      clipping_bbox.Set(clipping_point,true);
    }
  }

  bool rc = clipping_bbox.IsValid();

  if ( rc )
  {
    ON_Interval extents[2];
    for ( int i = 0; i < 2; i++ )
    {
      extents[i].Set( 
        0.5*(clipping_bbox.m_min[i]+1.0),
        0.5*(clipping_bbox.m_max[i]+1.0)
        );    
      
      if ( extents[i].IsIncreasing() || extents[i].IsSingleton() )
      {
        if ( extents[i].Intersection(unit_interval) && extents[i].IsValid() )
        {
          if ( extents[i].IsIncreasing() )
            continue;
          if ( extents[i].IsSingleton() )
            continue;
        }
      }

      rc = false;
      break;
    }

    if ( rc )
    {
      x_extents = extents[0];
      y_extents = extents[1];
    }
  }


  return rc;
}